

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

BxDFFlags __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this)

{
  DielectricInterfaceBxDF *pDVar1;
  undefined1 auVar2 [16];
  BxDFFlags BVar3;
  
  pDVar1 = this->top;
  if (pDVar1 != (DielectricInterfaceBxDF *)0x0) {
    auVar2 = vminss_avx(ZEXT416((uint)(pDVar1->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar1->mfDistrib).alpha_x));
    return (uint)(auVar2._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
  }
  BVar3 = IdealDiffuseBxDF::Flags(this->bottom);
  return BVar3;
}

Assistant:

PBRT_CPU_GPU
    BxDFFlags Flags() const { return top ? top->Flags() : bottom->Flags(); }